

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::QuadrifyPart
               (IfcVector2 *pmin,IfcVector2 *pmax,XYSortedField *field,
               vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
               *bbs,vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out)

{
  IfcFloat IVar1;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *pvVar2;
  bool bVar3;
  double *pdVar4;
  reference ppVar5;
  double dVar6;
  aiVector2t<double> local_168;
  aiVector2t<double> local_158;
  aiVector2t<double> local_148;
  aiVector2t<double> local_138;
  aiVector2t<double> local_128;
  aiVector2t<double> local_118;
  aiVector2t<double> local_108;
  aiVector2t<double> local_f8;
  aiVector2t<double> local_e8;
  double local_d8;
  IfcFloat ye;
  IfcFloat ys;
  BoundingBox *bb_1;
  double local_b8;
  IfcFloat ylast;
  aiVector2t<double> local_a0;
  aiVector2t<double> local_90;
  aiVector2t<double> local_80;
  aiVector2t<double> local_70;
  const_reference local_60;
  BoundingBox *bb;
  _Self local_50;
  iterator start;
  double dStack_40;
  bool found;
  IfcFloat xe;
  IfcFloat xs;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out_local;
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  *bbs_local;
  XYSortedField *field_local;
  IfcVector2 *pmax_local;
  IfcVector2 *pmin_local;
  
  dVar6 = pmin->x - pmax->x;
  if (((dVar6 != 0.0) || (NAN(dVar6))) &&
     ((dVar6 = pmin->y - pmax->y, dVar6 != 0.0 || (NAN(dVar6))))) {
    xe = 10000000000.0;
    dStack_40 = 10000000000.0;
    start._M_node._7_1_ = 0;
    xs = (IfcFloat)out;
    out_local = (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)bbs;
    bbs_local = (vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                 *)field;
    field_local = (XYSortedField *)pmax;
    pmax_local = pmin;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<aiVector2t<double>,_unsigned_long,_Assimp::IFC::XYSorter,_std::allocator<std::pair<const_aiVector2t<double>,_unsigned_long>_>_>
         ::begin(field);
    while( true ) {
      bb = (BoundingBox *)
           std::
           map<aiVector2t<double>,_unsigned_long,_Assimp::IFC::XYSorter,_std::allocator<std::pair<const_aiVector2t<double>,_unsigned_long>_>_>
           ::end((map<aiVector2t<double>,_unsigned_long,_Assimp::IFC::XYSorter,_std::allocator<std::pair<const_aiVector2t<double>,_unsigned_long>_>_>
                  *)bbs_local);
      bVar3 = std::operator!=(&local_50,(_Self *)&bb);
      pvVar2 = out_local;
      if (!bVar3) break;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_aiVector2t<double>,_unsigned_long>_>::
               operator*(&local_50);
      local_60 = std::
                 vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                 ::operator[]((vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                               *)pvVar2,ppVar5->second);
      if (*(double *)&(field_local->_M_t)._M_impl <= (local_60->first).x) break;
      dVar6 = (local_60->second).x;
      if (((pmax_local->x <= dVar6 && dVar6 != pmax_local->x) &&
          (dVar6 = (local_60->second).y, pmax_local->y <= dVar6 && dVar6 != pmax_local->y)) &&
         ((local_60->first).y <
          *(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header)) {
        xe = (local_60->first).x;
        dStack_40 = (local_60->second).x;
        start._M_node._7_1_ = 1;
        break;
      }
      std::_Rb_tree_iterator<std::pair<const_aiVector2t<double>,_unsigned_long>_>::operator++
                (&local_50);
    }
    if ((start._M_node._7_1_ & 1) == 0) {
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)xs,pmax_local);
      IVar1 = xs;
      aiVector2t<double>::aiVector2t
                (&local_70,pmax_local->x,
                 *(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header);
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,&local_70
                );
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)xs,
                 (value_type *)field_local);
      IVar1 = xs;
      aiVector2t<double>::aiVector2t
                (&local_80,*(double *)&(field_local->_M_t)._M_impl,pmax_local->y);
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,&local_80
                );
    }
    else {
      pdVar4 = std::max<double>(&pmax_local->x,&xe);
      xe = *pdVar4;
      pdVar4 = std::min<double>((double *)field_local,&stack0xffffffffffffffc0);
      dStack_40 = *pdVar4;
      dVar6 = xe - pmax_local->x;
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)xs,pmax_local
                  );
        IVar1 = xs;
        aiVector2t<double>::aiVector2t
                  (&local_90,pmax_local->x,
                   *(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,
                   &local_90);
        IVar1 = xs;
        aiVector2t<double>::aiVector2t
                  (&local_a0,xe,
                   *(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,
                   &local_a0);
        IVar1 = xs;
        aiVector2t<double>::aiVector2t((aiVector2t<double> *)&ylast,xe,pmax_local->y);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,
                   (value_type *)&ylast);
      }
      local_b8 = pmax_local->y;
      start._M_node._7_1_ = 0;
      while( true ) {
        bb_1 = (BoundingBox *)
               std::
               map<aiVector2t<double>,_unsigned_long,_Assimp::IFC::XYSorter,_std::allocator<std::pair<const_aiVector2t<double>,_unsigned_long>_>_>
               ::end((map<aiVector2t<double>,_unsigned_long,_Assimp::IFC::XYSorter,_std::allocator<std::pair<const_aiVector2t<double>,_unsigned_long>_>_>
                      *)bbs_local);
        bVar3 = std::operator!=(&local_50,(_Self *)&bb_1);
        pvVar2 = out_local;
        if (!bVar3) break;
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_aiVector2t<double>,_unsigned_long>_>::
                 operator*(&local_50);
        ys = (IfcFloat)
             std::
             vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
             ::operator[]((vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                           *)pvVar2,ppVar5->second);
        if ((xe < (((const_reference)ys)->first).x) ||
           (*(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header <=
            (((const_reference)ys)->first).y)) break;
        if (local_b8 < (((const_reference)ys)->second).y) {
          start._M_node._7_1_ = 1;
          pdVar4 = std::max<double>(&(((const_reference)ys)->first).y,&pmax_local->y);
          ye = *pdVar4;
          pdVar4 = std::min<double>((double *)((long)ys + 0x18),
                                    (double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header);
          local_d8 = *pdVar4;
          if (0.0 < ye - local_b8) {
            aiVector2t<double>::aiVector2t(&local_e8,xe,local_b8);
            aiVector2t<double>::aiVector2t(&local_f8,dStack_40,ye);
            QuadrifyPart(&local_e8,&local_f8,(XYSortedField *)bbs_local,
                         (vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                          *)out_local,
                         (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)xs);
          }
          local_b8 = local_d8;
        }
        std::_Rb_tree_iterator<std::pair<const_aiVector2t<double>,_unsigned_long>_>::operator++
                  (&local_50);
      }
      IVar1 = xs;
      if ((start._M_node._7_1_ & 1) == 0) {
        aiVector2t<double>::aiVector2t(&local_108,xe,pmax_local->y);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,
                   &local_108);
        IVar1 = xs;
        aiVector2t<double>::aiVector2t
                  (&local_118,xe,
                   *(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,
                   &local_118);
        IVar1 = xs;
        aiVector2t<double>::aiVector2t
                  (&local_128,dStack_40,
                   *(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,
                   &local_128);
        IVar1 = xs;
        aiVector2t<double>::aiVector2t(&local_138,dStack_40,pmax_local->y);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)IVar1,
                   &local_138);
      }
      else {
        if (local_b8 < *(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header) {
          aiVector2t<double>::aiVector2t(&local_148,xe,local_b8);
          aiVector2t<double>::aiVector2t
                    (&local_158,dStack_40,
                     *(double *)&(field_local->_M_t)._M_impl.super__Rb_tree_header._M_header);
          QuadrifyPart(&local_148,&local_158,(XYSortedField *)bbs_local,
                       (vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                        *)out_local,
                       (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)xs);
        }
        dVar6 = *(double *)&(field_local->_M_t)._M_impl - dStack_40;
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          aiVector2t<double>::aiVector2t(&local_168,dStack_40,pmax_local->y);
          QuadrifyPart(&local_168,(IfcVector2 *)field_local,(XYSortedField *)bbs_local,
                       (vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                        *)out_local,
                       (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)xs);
        }
      }
    }
  }
  return;
}

Assistant:

void QuadrifyPart(const IfcVector2& pmin, const IfcVector2& pmax, XYSortedField& field,
    const std::vector< BoundingBox >& bbs,
    std::vector<IfcVector2>& out)
{
    if (!(pmin.x-pmax.x) || !(pmin.y-pmax.y)) {
        return;
    }

    IfcFloat xs = 1e10, xe = 1e10;
    bool found = false;

    // Search along the x-axis until we find an opening
    XYSortedField::iterator start = field.begin();
    for(; start != field.end(); ++start) {
        const BoundingBox& bb = bbs[(*start).second];
        if(bb.first.x >= pmax.x) {
            break;
        }

        if (bb.second.x > pmin.x && bb.second.y > pmin.y && bb.first.y < pmax.y) {
            xs = bb.first.x;
            xe = bb.second.x;
            found = true;
            break;
        }
    }

    if (!found) {
        // the rectangle [pmin,pend] is opaque, fill it
        out.push_back(pmin);
        out.push_back(IfcVector2(pmin.x,pmax.y));
        out.push_back(pmax);
        out.push_back(IfcVector2(pmax.x,pmin.y));
        return;
    }

    xs = std::max(pmin.x,xs);
    xe = std::min(pmax.x,xe);

    // see if there's an offset to fill at the top of our quad
    if (xs - pmin.x) {
        out.push_back(pmin);
        out.push_back(IfcVector2(pmin.x,pmax.y));
        out.push_back(IfcVector2(xs,pmax.y));
        out.push_back(IfcVector2(xs,pmin.y));
    }

    // search along the y-axis for all openings that overlap xs and our quad
    IfcFloat ylast = pmin.y;
    found = false;
    for(; start != field.end(); ++start) {
        const BoundingBox& bb = bbs[(*start).second];
        if (bb.first.x > xs || bb.first.y >= pmax.y) {
            break;
        }

        if (bb.second.y > ylast) {

            found = true;
            const IfcFloat ys = std::max(bb.first.y,pmin.y), ye = std::min(bb.second.y,pmax.y);
            if (ys - ylast > 0.0f) {
                QuadrifyPart( IfcVector2(xs,ylast), IfcVector2(xe,ys) ,field,bbs,out);
            }

            // the following are the window vertices

            /*wnd.push_back(IfcVector2(xs,ys));
            wnd.push_back(IfcVector2(xs,ye));
            wnd.push_back(IfcVector2(xe,ye));
            wnd.push_back(IfcVector2(xe,ys));*/
            ylast = ye;
        }
    }
    if (!found) {
        // the rectangle [pmin,pend] is opaque, fill it
        out.push_back(IfcVector2(xs,pmin.y));
        out.push_back(IfcVector2(xs,pmax.y));
        out.push_back(IfcVector2(xe,pmax.y));
        out.push_back(IfcVector2(xe,pmin.y));
        return;
    }
    if (ylast < pmax.y) {
        QuadrifyPart( IfcVector2(xs,ylast), IfcVector2(xe,pmax.y) ,field,bbs,out);
    }

    // now for the whole rest
    if (pmax.x-xe) {
        QuadrifyPart(IfcVector2(xe,pmin.y), pmax ,field,bbs,out);
    }
}